

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool duckdb_re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  StringPiece vec [17];
  StringPiece local_148 [17];
  
  uVar6 = 0;
  memset(local_148,0,0x110);
  if (0 < (long)rewrite->size_) {
    pcVar4 = rewrite->data_;
    pcVar3 = pcVar4 + rewrite->size_;
    uVar6 = 0;
    do {
      if (*pcVar4 == '\\') {
        pcVar4 = pcVar4 + 1;
        uVar5 = 0xffffffcf;
        if (pcVar4 < pcVar3) {
          uVar5 = (int)*pcVar4 - 0x30;
        }
        uVar7 = uVar6;
        if ((int)uVar6 < (int)uVar5) {
          uVar7 = uVar5;
        }
        if (uVar5 < 10) {
          uVar6 = uVar7;
        }
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar3);
  }
  bVar2 = false;
  if ((uVar6 < 0x11) && (bVar2 = false, (int)uVar6 <= re->num_captures_)) {
    bVar2 = false;
    bVar1 = Match(re,text,0,text->size_,UNANCHORED,local_148,uVar6 + 1);
    if (bVar1) {
      out->_M_string_length = 0;
      *(out->_M_dataplus)._M_p = '\0';
      bVar2 = Rewrite(re,out,rewrite,local_148,uVar6 + 1);
    }
  }
  return bVar2;
}

Assistant:

bool RE2::Extract(const StringPiece& text,
                  const RE2& re,
                  const StringPiece& rewrite,
                  std::string* out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;
  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}